

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

int Lpk_Resynthesize(Abc_Ntk_t *pNtk,Lpk_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  void *pvVar4;
  Lpk_Man_t *p_00;
  Vec_Vec_t *pVVar5;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  abctime aVar6;
  double local_130;
  double local_120;
  double local_110;
  double local_100;
  double local_f0;
  double local_e0;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  double local_80;
  abctime clk;
  int nNodesPrev;
  int nNodes;
  int Iter;
  int i;
  double Delta;
  Abc_Obj_t *pObj;
  Lpk_Man_t *p;
  ProgressBar *pProgress;
  Lpk_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  p = (Lpk_Man_t *)0x0;
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x202,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkSweep(pNtk,0);
  pvVar4 = Abc_FrameReadLibLut();
  if (pvVar4 == (void *)0x0) {
    iVar1 = Abc_NtkGetFaninMax(pNtk);
    pPars->nLutSize = iVar1;
  }
  else {
    pvVar4 = Abc_FrameReadLibLut();
    pPars->nLutSize = *(int *)((long)pvVar4 + 8);
  }
  if (6 < pPars->nLutSize) {
    pPars->nLutSize = 6;
  }
  if (pPars->nLutSize < 3) {
    pPars->nLutSize = 3;
  }
  if (pPars->nLutSize + -2 < pPars->nVarsShared) {
    pPars->nVarsShared = pPars->nLutSize + -2;
  }
  pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize + -1) + 1;
  while (0x10 < pPars->nVarsMax) {
    pPars->nLutsMax = pPars->nLutsMax + -1;
    pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize + -1) + 1;
  }
  if (pPars->fVerbose != 0) {
    printf("Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
           (ulong)(uint)pPars->nLutsMax,(ulong)(uint)pPars->nLutSize,(ulong)(uint)pPars->nLutsOver,
           (ulong)(uint)pPars->nVarsShared,(ulong)(uint)pPars->nVarsMax);
  }
  iVar1 = Abc_NtkToAig(pNtk);
  if (iVar1 == 0) {
    fprintf(_stdout,"Converting to BDD has failed.\n");
    return 0;
  }
  iVar1 = Abc_NtkHasAig(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasAig(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                  ,0x228,"int Lpk_Resynthesize(Abc_Ntk_t *, Lpk_Par_t *)");
  }
  Abc_NtkLevel(pNtk);
  Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
  p_00 = Lpk_ManStart(pPars);
  p_00->pNtk = pNtk;
  iVar1 = Abc_NtkNodeNum(pNtk);
  p_00->nNodesTotal = iVar1;
  pVVar5 = Vec_VecStart(pNtk->LevelMax);
  p_00->vLevels = pVVar5;
  if (p_00->pPars->fSatur != 0) {
    pVVar5 = Vec_VecStart(0);
    p_00->vVisited = pVVar5;
  }
  if (pPars->fVerbose != 0) {
    iVar1 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalNets = iVar1;
    iVar1 = Abc_NtkNodeNum(pNtk);
    p_00->nTotalNodes = iVar1;
  }
  clk._0_4_ = p_00->nNodesTotal;
  nNodesPrev = 1;
  do {
    if (p_00->pPars->fSatur != 0) {
      pVVar5 = p_00->vVisited;
      iVar1 = Abc_NtkObjNumMax(pNtk);
      Vec_VecExpand(pVVar5,iVar1 + 1);
    }
    iVar1 = Abc_NtkObjNumMax(pNtk);
    if (pPars->fVeryVerbose == 0) {
      p = (Lpk_Man_t *)Extra_ProgressBarStart((FILE *)_stdout,iVar1);
    }
    for (nNodes = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nNodes < iVar2; nNodes = nNodes + 1) {
      pObj_00 = Abc_NtkObj(pNtk,nNodes);
      if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0)) {
        if (pPars->fFirst != 0) {
          pObj_01 = Abc_ObjFanout0(pObj_00);
          iVar2 = Abc_ObjIsCo(pObj_01);
          if (iVar2 == 0) goto LAB_0059b4fb;
        }
        if (iVar1 <= nNodes) break;
        if (pPars->fVeryVerbose == 0) {
          Extra_ProgressBarUpdate((ProgressBar *)p,nNodes,(char *)0x0);
        }
        if ((p_00->pPars->fSatur == 0) || (iVar2 = Lpk_NodeHasChanged(p_00,pObj_00->Id), iVar2 != 0)
           ) {
          p_00->pObj = pObj_00;
          if (p_00->pPars->fOldAlgo == 0) {
            Lpk_ResynthesizeNodeNew(p_00);
          }
          else {
            Lpk_ResynthesizeNode(p_00);
          }
        }
      }
LAB_0059b4fb:
    }
    if (pPars->fVeryVerbose == 0) {
      Extra_ProgressBarStop((ProgressBar *)p);
    }
    iVar1 = Abc_NtkNodeNum(pNtk);
    if (((((double)((int)clk - iVar1) * 100.0) / (double)p_00->nNodesTotal < 0.05) ||
        (clk._0_4_ = Abc_NtkNodeNum(pNtk), p_00->pPars->fSatur == 0)) || (pPars->fFirst != 0)) {
      Abc_NtkStopReverseLevels(pNtk);
      if (pPars->fVerbose != 0) {
        iVar1 = Abc_NtkGetTotalFanins(pNtk);
        p_00->nTotalNets2 = iVar1;
        iVar1 = Abc_NtkNodeNum(pNtk);
        p_00->nTotalNodes2 = iVar1;
        printf("Node gain = %5d. (%.2f %%)  ",
               ((double)(p_00->nTotalNodes - p_00->nTotalNodes2) * 100.0) /
               (double)p_00->nTotalNodes,(ulong)(uint)(p_00->nTotalNodes - p_00->nTotalNodes2));
        printf("Edge gain = %5d. (%.2f %%)  ",
               ((double)(p_00->nTotalNets - p_00->nTotalNets2) * 100.0) / (double)p_00->nTotalNets,
               (ulong)(uint)(p_00->nTotalNets - p_00->nTotalNets2));
        printf("Muxes = %4d. Dsds = %4d.",(ulong)(uint)p_00->nMuxes,(ulong)(uint)p_00->nDsds);
        printf("\n");
        printf("Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n",
               (ulong)(uint)p_00->nNodesTotal,(ulong)(uint)p_00->nNodesOver,
               (ulong)(uint)p_00->nCutsTotal,(ulong)(uint)p_00->nCutsUseful,
               (ulong)(uint)p_00->nChanges,nNodesPrev,p_00->nBenefited);
        printf("Non-DSD:");
        for (nNodes = 3; nNodes <= pPars->nVarsMax; nNodes = nNodes + 1) {
          if (p_00->nBlocks[nNodes] != 0) {
            printf(" %d=%d",(ulong)(uint)nNodes,(ulong)(uint)p_00->nBlocks[nNodes]);
          }
        }
        printf("\n");
        aVar6 = Abc_Clock();
        p_00->timeTotal = aVar6 - aVar3;
        p_00->timeEval = p_00->timeEval - p_00->timeMap;
        p_00->timeOther =
             (((p_00->timeTotal - p_00->timeCuts) - p_00->timeTruth) - p_00->timeEval) -
             p_00->timeMap;
        Abc_Print(1,"%s =","Cuts  ");
        if (p_00->timeTotal == 0) {
          local_80 = 0.0;
        }
        else {
          local_80 = ((double)p_00->timeCuts * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeCuts * 1.0) / 1000000.0,local_80);
        Abc_Print(1,"%s =","Truth ");
        if (p_00->timeTotal == 0) {
          local_90 = 0.0;
        }
        else {
          local_90 = ((double)p_00->timeTruth * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeTruth * 1.0) / 1000000.0,local_90);
        Abc_Print(1,"%s =","CSupps");
        if (p_00->timeTotal == 0) {
          local_a0 = 0.0;
        }
        else {
          local_a0 = ((double)p_00->timeSupps * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeSupps * 1.0) / 1000000.0,local_a0);
        Abc_Print(1,"%s =","Eval  ");
        if (p_00->timeTotal == 0) {
          local_b0 = 0.0;
        }
        else {
          local_b0 = ((double)p_00->timeEval * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeEval * 1.0) / 1000000.0,local_b0);
        Abc_Print(1,"%s ="," MuxAn");
        if (p_00->timeEval == 0) {
          local_c0 = 0.0;
        }
        else {
          local_c0 = ((double)p_00->timeEvalMuxAn * 100.0) / (double)p_00->timeEval;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeEvalMuxAn * 1.0) / 1000000.0,
                  local_c0);
        Abc_Print(1,"%s ="," MuxSp");
        if (p_00->timeEval == 0) {
          local_d0 = 0.0;
        }
        else {
          local_d0 = ((double)p_00->timeEvalMuxSp * 100.0) / (double)p_00->timeEval;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeEvalMuxSp * 1.0) / 1000000.0,
                  local_d0);
        Abc_Print(1,"%s ="," DsdAn");
        if (p_00->timeEval == 0) {
          local_e0 = 0.0;
        }
        else {
          local_e0 = ((double)p_00->timeEvalDsdAn * 100.0) / (double)p_00->timeEval;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeEvalDsdAn * 1.0) / 1000000.0,
                  local_e0);
        Abc_Print(1,"%s ="," DsdSp");
        if (p_00->timeEval == 0) {
          local_f0 = 0.0;
        }
        else {
          local_f0 = ((double)p_00->timeEvalDsdSp * 100.0) / (double)p_00->timeEval;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeEvalDsdSp * 1.0) / 1000000.0,
                  local_f0);
        Abc_Print(1,"%s ="," Other");
        if (p_00->timeEval == 0) {
          local_100 = 0.0;
        }
        else {
          local_100 = ((double)((((p_00->timeEval - p_00->timeEvalMuxAn) - p_00->timeEvalMuxSp) -
                                p_00->timeEvalDsdAn) - p_00->timeEvalDsdSp) * 100.0) /
                      (double)p_00->timeEval;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",
                  ((double)((((p_00->timeEval - p_00->timeEvalMuxAn) - p_00->timeEvalMuxSp) -
                            p_00->timeEvalDsdAn) - p_00->timeEvalDsdSp) * 1.0) / 1000000.0,local_100
                 );
        Abc_Print(1,"%s =","Map   ");
        if (p_00->timeTotal == 0) {
          local_110 = 0.0;
        }
        else {
          local_110 = ((double)p_00->timeMap * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeMap * 1.0) / 1000000.0,local_110);
        Abc_Print(1,"%s =","Other ");
        if (p_00->timeTotal == 0) {
          local_120 = 0.0;
        }
        else {
          local_120 = ((double)p_00->timeOther * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeOther * 1.0) / 1000000.0,local_120);
        Abc_Print(1,"%s =","TOTAL ");
        if (p_00->timeTotal == 0) {
          local_130 = 0.0;
        }
        else {
          local_130 = ((double)p_00->timeTotal * 100.0) / (double)p_00->timeTotal;
        }
        Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeTotal * 1.0) / 1000000.0,local_130);
      }
      Lpk_ManStop(p_00);
      iVar1 = Abc_NtkCheck(pNtk);
      if (iVar1 == 0) {
        printf("Lpk_Resynthesize: The network check has failed.\n");
        return 0;
      }
      return 1;
    }
    nNodesPrev = nNodesPrev + 1;
  } while( true );
}

Assistant:

int Lpk_Resynthesize( Abc_Ntk_t * pNtk, Lpk_Par_t * pPars )
{
    ProgressBar * pProgress = NULL; // Suppress "might be used uninitialized"
    Lpk_Man_t * p;
    Abc_Obj_t * pObj;
    double Delta;
//    int * pnFanouts, nObjMax;
    int i, Iter, nNodes, nNodesPrev;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
 
    // sweep dangling nodes as a preprocessing step
    Abc_NtkSweep( pNtk, 0 );

    // get the number of inputs
    if ( Abc_FrameReadLibLut() )
        pPars->nLutSize = ((If_LibLut_t *)Abc_FrameReadLibLut())->LutMax;
    else
        pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
        pPars->nLutSize = 6;
    if ( pPars->nLutSize < 3 )
        pPars->nLutSize = 3;
    // adjust the number of crossbars based on LUT size
    if ( pPars->nVarsShared > pPars->nLutSize - 2 )
        pPars->nVarsShared = pPars->nLutSize - 2;
    // get the max number of LUTs tried
    pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1; // V = N * (K-1) + 1
    while ( pPars->nVarsMax > 16 )
    {
        pPars->nLutsMax--;
        pPars->nVarsMax = pPars->nLutsMax * (pPars->nLutSize - 1) + 1;

    }
    if ( pPars->fVerbose )
    {
        printf( "Resynthesis for %d %d-LUTs with %d non-MFFC LUTs, %d crossbars, and %d-input cuts.\n",
            pPars->nLutsMax, pPars->nLutSize, pPars->nLutsOver, pPars->nVarsShared, pPars->nVarsMax );
    }
 

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // start the manager
    p = Lpk_ManStart( pPars );
    p->pNtk = pNtk;
    p->nNodesTotal = Abc_NtkNodeNum(pNtk);
    p->vLevels = Vec_VecStart( pNtk->LevelMax ); 
    if ( p->pPars->fSatur )
        p->vVisited = Vec_VecStart( 0 );
    if ( pPars->fVerbose )
    {
        p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    }
/*
    // save the number of fanouts of all objects
    nObjMax = Abc_NtkObjNumMax( pNtk );
    pnFanouts = ABC_ALLOC( int, nObjMax );
    memset( pnFanouts, 0, sizeof(int) * nObjMax );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pnFanouts[pObj->Id] = Abc_ObjFanoutNum(pObj);
*/

    // iterate over the network
    nNodesPrev = p->nNodesTotal;
    for ( Iter = 1; ; Iter++ )
    {
        // expand storage for changed nodes
        if ( p->pPars->fSatur )
            Vec_VecExpand( p->vVisited, Abc_NtkObjNumMax(pNtk) + 1 );

        // consider all nodes
        nNodes = Abc_NtkObjNumMax(pNtk);
        if ( !pPars->fVeryVerbose )
            pProgress = Extra_ProgressBarStart( stdout, nNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
        {
            // skip all except the final node
            if ( pPars->fFirst )
            {
                if ( !Abc_ObjIsCo(Abc_ObjFanout0(pObj)) )
                    continue;
            }
            if ( i >= nNodes )
                break;
            if ( !pPars->fVeryVerbose )
                Extra_ProgressBarUpdate( pProgress, i, NULL );
            // skip the nodes that did not change
            if ( p->pPars->fSatur && !Lpk_NodeHasChanged(p, pObj->Id) )
                continue;
            // resynthesize
            p->pObj = pObj;
            if ( p->pPars->fOldAlgo )
                Lpk_ResynthesizeNode( p );
            else
                Lpk_ResynthesizeNodeNew( p );
        }
        if ( !pPars->fVeryVerbose )
            Extra_ProgressBarStop( pProgress );

        // check the increase
        Delta = 100.00 * (nNodesPrev - Abc_NtkNodeNum(pNtk)) / p->nNodesTotal;
        if ( Delta < 0.05 )
            break;
        nNodesPrev = Abc_NtkNodeNum(pNtk);
        if ( !p->pPars->fSatur )
            break;

        if ( pPars->fFirst )
            break;
    }
    Abc_NtkStopReverseLevels( pNtk );
/*
    // report the fanout changes
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i >= nObjMax )
            continue;
        if ( Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] == 0 )
            continue;
        printf( "%d ", Abc_ObjFanoutNum(pObj) - pnFanouts[pObj->Id] );
    }
    printf( "\n" );
*/

    if ( pPars->fVerbose )
    {
//        Cloud_PrintInfo( p->pDsdMan->dd );
        p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
        p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);
        printf( "Node gain = %5d. (%.2f %%)  ", 
            p->nTotalNodes-p->nTotalNodes2, 100.0*(p->nTotalNodes-p->nTotalNodes2)/p->nTotalNodes );
        printf( "Edge gain = %5d. (%.2f %%)  ", 
            p->nTotalNets-p->nTotalNets2, 100.0*(p->nTotalNets-p->nTotalNets2)/p->nTotalNets );
        printf( "Muxes = %4d. Dsds = %4d.", p->nMuxes, p->nDsds );
        printf( "\n" );
        printf( "Nodes = %5d (%3d)  Cuts = %5d (%4d)  Changes = %5d  Iter = %2d  Benefit = %d.\n", 
            p->nNodesTotal, p->nNodesOver, p->nCutsTotal, p->nCutsUseful, p->nChanges, Iter, p->nBenefited );

        printf( "Non-DSD:" );
        for ( i = 3; i <= pPars->nVarsMax; i++ )
            if ( p->nBlocks[i] )
                printf( " %d=%d", i, p->nBlocks[i] );
        printf( "\n" );

        p->timeTotal = Abc_Clock() - clk;
        p->timeEval  = p->timeEval  - p->timeMap;
        p->timeOther = p->timeTotal - p->timeCuts - p->timeTruth - p->timeEval - p->timeMap;
        ABC_PRTP( "Cuts  ", p->timeCuts,  p->timeTotal );
        ABC_PRTP( "Truth ", p->timeTruth, p->timeTotal );
        ABC_PRTP( "CSupps", p->timeSupps, p->timeTotal );
        ABC_PRTP( "Eval  ", p->timeEval,  p->timeTotal );
        ABC_PRTP( " MuxAn", p->timeEvalMuxAn, p->timeEval );
        ABC_PRTP( " MuxSp", p->timeEvalMuxSp, p->timeEval );
        ABC_PRTP( " DsdAn", p->timeEvalDsdAn, p->timeEval );
        ABC_PRTP( " DsdSp", p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( " Other", p->timeEval-p->timeEvalMuxAn-p->timeEvalMuxSp-p->timeEvalDsdAn-p->timeEvalDsdSp, p->timeEval );
        ABC_PRTP( "Map   ", p->timeMap,   p->timeTotal );
        ABC_PRTP( "Other ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL ", p->timeTotal, p->timeTotal );
    }

    Lpk_ManStop( p );
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Lpk_Resynthesize: The network check has failed.\n" );
        return 0;
    }
    return 1;
}